

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_avx512::forward_inplace
          (BatchNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [64];
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  
  iVar1 = bottom_top_blob->elempack;
  iVar14 = bottom_top_blob->dims;
  iVar2 = bottom_top_blob->w;
  uVar3 = bottom_top_blob->h;
  iVar10 = bottom_top_blob->d;
  uVar4 = bottom_top_blob->c;
  if (iVar14 == 2) {
    iVar11 = iVar1 * iVar2;
    uVar17 = 0;
    uVar12 = 0;
    if (0 < (int)uVar3) {
      uVar12 = (ulong)uVar3;
    }
    for (; uVar17 != uVar12; uVar17 = uVar17 + 1) {
      pvVar7 = (this->super_BatchNorm).a_data.data;
      pvVar8 = (this->super_BatchNorm).b_data.data;
      uVar5 = *(uint *)((long)pvVar7 + uVar17 * 4);
      uVar6 = *(uint *)((long)pvVar8 + uVar17 * 4);
      if (iVar1 == 4) {
        auVar18 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])((long)pvVar7 + uVar17 * 0x10));
        auVar20 = *(undefined1 (*) [16])((long)pvVar8 + uVar17 * 0x10);
        auVar22 = auVar18._0_16_;
        auVar26._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar22;
        auVar26._32_32_ = in_ZMM4._32_32_;
        auVar26._16_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar22;
        auVar19 = ZEXT3264(CONCAT1616(auVar20,auVar20));
LAB_0013d927:
        auVar24 = auVar19._0_32_;
        auVar19 = vinserti64x4_avx512f(auVar19,auVar24,1);
        in_ZMM4 = auVar26;
      }
      else {
        auVar22._4_4_ = uVar5;
        auVar22._0_4_ = uVar5;
        auVar22._8_4_ = uVar5;
        auVar22._12_4_ = uVar5;
        auVar20._4_4_ = uVar6;
        auVar20._0_4_ = uVar6;
        auVar20._8_4_ = uVar6;
        auVar20._12_4_ = uVar6;
        if (iVar1 == 8) {
          auVar18 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])((long)pvVar7 + uVar17 * 0x20));
          auVar19 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar8 + uVar17 * 0x20));
          auVar26 = ZEXT3264(auVar18._0_32_);
          goto LAB_0013d927;
        }
        auVar26 = ZEXT3264(CONCAT428(uVar5,CONCAT424(uVar5,CONCAT420(uVar5,CONCAT416(uVar5,CONCAT412
                                                  (uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))))))))
        ;
        auVar24._4_4_ = uVar6;
        auVar24._0_4_ = uVar6;
        auVar24._8_4_ = uVar6;
        auVar24._12_4_ = uVar6;
        auVar24._16_4_ = uVar6;
        auVar24._20_4_ = uVar6;
        auVar24._24_4_ = uVar6;
        auVar24._28_4_ = uVar6;
        auVar19 = ZEXT3264(auVar24);
        if (iVar1 != 0x10) {
          auVar18 = vpbroadcastd_avx512f(auVar22);
          goto LAB_0013d927;
        }
        auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar7 + uVar17 * 0x40));
        auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar8 + uVar17 * 0x40));
        in_ZMM4 = auVar26;
      }
      pauVar13 = (undefined1 (*) [64])
                 ((long)bottom_top_blob->w * uVar17 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar15 = 0; iVar15 + 0xf < iVar11; iVar15 = iVar15 + 0x10) {
        auVar26 = vfmadd132ps_avx512f(*pauVar13,auVar18,auVar19);
        *pauVar13 = auVar26;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar15 + 7 < iVar11; iVar15 = iVar15 + 8) {
        auVar21 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar13,in_ZMM4._0_32_,auVar24);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar21);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar15 + 3 < iVar11; iVar15 = iVar15 + 4) {
        auVar21 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar22,auVar20);
        in_ZMM4 = ZEXT1664(auVar21);
        *(undefined1 (*) [16])*pauVar13 = auVar21;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar15 < iVar11; iVar15 = iVar15 + 1) {
        auVar20 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar13),ZEXT416(uVar5),ZEXT416(uVar6));
        *(int *)*pauVar13 = auVar20._0_4_;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  else if (iVar14 == 1) {
    pvVar7 = bottom_top_blob->data;
    pvVar8 = (this->super_BatchNorm).a_data.data;
    pvVar9 = (this->super_BatchNorm).b_data.data;
    iVar11 = iVar1 * iVar2;
    for (uVar17 = 0; (int)uVar17 + 0xf < iVar11; uVar17 = uVar17 + 0x10) {
      auVar18 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pvVar9 + uVar17 * 4),
                                    *(undefined1 (*) [64])((long)pvVar7 + uVar17 * 4),
                                    *(undefined1 (*) [64])((long)pvVar8 + uVar17 * 4));
      *(undefined1 (*) [64])((long)pvVar7 + uVar17 * 4) = auVar18;
    }
    for (; (int)uVar17 + 7 < iVar11; uVar17 = uVar17 + 8) {
      auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar9 + uVar17 * 4),
                                *(undefined1 (*) [32])((long)pvVar7 + uVar17 * 4),
                                *(undefined1 (*) [32])((long)pvVar8 + uVar17 * 4));
      *(undefined1 (*) [32])((long)pvVar7 + uVar17 * 4) = ZEXT1632(auVar20);
    }
    for (; (int)uVar17 + 3 < iVar11; uVar17 = uVar17 + 4) {
      auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar9 + uVar17 * 4),
                                *(undefined1 (*) [16])((long)pvVar7 + uVar17 * 4),
                                *(undefined1 (*) [16])((long)pvVar8 + uVar17 * 4));
      *(undefined1 (*) [16])((long)pvVar7 + uVar17 * 4) = auVar20;
    }
    lVar16 = 0;
    for (uVar12 = uVar17 & 0xffffffff; (int)uVar12 < iVar11; uVar12 = (ulong)((int)uVar12 + 1)) {
      auVar20 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar7 + uVar17 * 4 + lVar16)),
                                ZEXT416(*(uint *)((long)pvVar9 + uVar17 * 4 + lVar16)),
                                ZEXT416(*(uint *)((long)pvVar8 + uVar17 * 4 + lVar16)));
      *(int *)((long)pvVar7 + uVar17 * 4 + lVar16) = auVar20._0_4_;
      lVar16 = lVar16 + 4;
    }
  }
  if (iVar14 - 3U < 2) {
    iVar10 = iVar2 * iVar1 * uVar3 * iVar10;
    uVar12 = 0;
    uVar17 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar17 = uVar12;
    }
    for (; uVar12 != uVar17; uVar12 = uVar12 + 1) {
      pvVar7 = (this->super_BatchNorm).a_data.data;
      pvVar8 = (this->super_BatchNorm).b_data.data;
      uVar3 = *(uint *)((long)pvVar7 + uVar12 * 4);
      uVar4 = *(uint *)((long)pvVar8 + uVar12 * 4);
      if (iVar1 == 4) {
        auVar18 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])((long)pvVar7 + uVar12 * 0x10));
        auVar21 = *(undefined1 (*) [16])((long)pvVar8 + uVar12 * 0x10);
        auVar23 = auVar18._0_16_;
        auVar19._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar23;
        auVar19._32_32_ = in_ZMM4._32_32_;
        auVar19._16_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar23;
        auVar26 = ZEXT3264(CONCAT1616(auVar21,auVar21));
LAB_0013da9a:
        auVar25 = auVar26._0_32_;
        auVar26 = vinserti64x4_avx512f(auVar26,auVar25,1);
        in_ZMM4 = auVar19;
      }
      else {
        auVar23._4_4_ = uVar3;
        auVar23._0_4_ = uVar3;
        auVar23._8_4_ = uVar3;
        auVar23._12_4_ = uVar3;
        auVar21._4_4_ = uVar4;
        auVar21._0_4_ = uVar4;
        auVar21._8_4_ = uVar4;
        auVar21._12_4_ = uVar4;
        if (iVar1 == 8) {
          auVar18 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])((long)pvVar7 + uVar12 * 0x20));
          auVar26 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar8 + uVar12 * 0x20));
          auVar19 = ZEXT3264(auVar18._0_32_);
          goto LAB_0013da9a;
        }
        auVar19 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412
                                                  (uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))))
        ;
        auVar25._4_4_ = uVar4;
        auVar25._0_4_ = uVar4;
        auVar25._8_4_ = uVar4;
        auVar25._12_4_ = uVar4;
        auVar25._16_4_ = uVar4;
        auVar25._20_4_ = uVar4;
        auVar25._24_4_ = uVar4;
        auVar25._28_4_ = uVar4;
        auVar26 = ZEXT3264(auVar25);
        if (iVar1 != 0x10) {
          auVar18 = vpbroadcastd_avx512f(auVar23);
          goto LAB_0013da9a;
        }
        auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar7 + uVar12 * 0x40));
        auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pvVar8 + uVar12 * 0x40));
        in_ZMM4 = auVar19;
      }
      pauVar13 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * uVar12 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar14 = 0; iVar14 + 0xf < iVar10; iVar14 = iVar14 + 0x10) {
        auVar19 = vfmadd132ps_avx512f(*pauVar13,auVar18,auVar26);
        *pauVar13 = auVar19;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar14 + 7 < iVar10; iVar14 = iVar14 + 8) {
        auVar20 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar13,in_ZMM4._0_32_,auVar25);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar20);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar20 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar13,auVar23,auVar21);
        in_ZMM4 = ZEXT1664(auVar20);
        *(undefined1 (*) [16])*pauVar13 = auVar20;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar14 < iVar10; iVar14 = iVar14 + 1) {
        auVar20 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar13),ZEXT416(uVar3),ZEXT416(uVar4));
        *(int *)*pauVar13 = auVar20._0_4_;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}